

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

walk_result __thiscall
jsoncons::jsonschema::
unique_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(unique_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *param_5,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *param_7)

{
  bool bVar1;
  json_pointer *pjVar2;
  undefined8 in_RCX;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RSI;
  keyword_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
  *in_RDI;
  walk_result result;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  validation_message *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  walk_result in_stack_fffffffffffffe04;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffe48;
  undefined1 local_198 [280];
  walk_result local_80;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_70;
  undefined8 local_28;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_18;
  walk_result local_4;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (in_stack_fffffffffffffe18);
  if (!bVar1) {
    return advance;
  }
  keyword_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
  keyword_name_abi_cxx11_(in_RDI);
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(local_18,(eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                           *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe20);
  if ((((byte)in_RDI[0xe0] & 1) != 0) &&
     (bVar1 = array_has_unique_items(in_stack_fffffffffffffe48), !bVar1)) {
    pjVar2 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ::eval_path(&local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),(char *)in_RDI,
               (allocator<char> *)local_18);
    (**(code **)(*(long *)in_RDI + 0x10))(local_198,in_RDI,pjVar2,local_28,&stack0xfffffffffffffe48)
    ;
    in_stack_fffffffffffffe04 =
         error_reporter::error
                   ((error_reporter *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                    in_stack_fffffffffffffdf8);
    validation_message::~validation_message
              ((validation_message *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
    local_80 = in_stack_fffffffffffffe04;
    if (in_stack_fffffffffffffe04 == abort) {
      local_4 = abort;
      goto LAB_00751c98;
    }
  }
  local_4 = advance;
LAB_00751c98:
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  return local_4;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter,
            Json& /*patch*/) const final
        {
            if (!instance.is_array())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            if (are_unique_ && !array_has_unique_items(instance))
            {
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    "Array items are not unique"));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            return walk_result::advance;
        }